

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

BOOL __thiscall
Js::FunctionBody::GetBranchOffsetWithin
          (FunctionBody *this,uint start,uint end,StatementAdjustmentRecord *record)

{
  int iVar1;
  AuxStatementData *pAVar2;
  List<Js::FunctionBody::StatementAdjustmentRecord,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar3;
  code *pcVar4;
  bool bVar5;
  uint uVar6;
  undefined4 *puVar7;
  Type *other;
  int index;
  uint uVar8;
  StatementAdjustmentRecord local_40;
  StatementAdjustmentRecord item;
  
  item.m_byteCodeOffset = start;
  item._4_4_ = end;
  if (end <= start) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x13f,"(start < end)","start < end");
    if (!bVar5) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar7 = 0;
  }
  pAVar2 = (this->m_sourceInfo).m_auxStatementData.ptr;
  uVar8 = 0;
  if ((pAVar2 != (AuxStatementData *)0x0) &&
     (pLVar3 = (pAVar2->m_statementAdjustmentRecords).ptr, uVar8 = 0,
     pLVar3 != (List<Js::FunctionBody::StatementAdjustmentRecord,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>
                *)0x0)) {
    iVar1 = (pLVar3->
            super_ReadOnlyList<Js::FunctionBody::StatementAdjustmentRecord,_Memory::Recycler,_DefaultComparer>
            ).count;
    index = 0;
    if (iVar1 < 1) {
      uVar8 = 0;
    }
    else {
      uVar8 = 1;
      do {
        other = JsUtil::
                List<Js::FunctionBody::StatementAdjustmentRecord,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item((((this->m_sourceInfo).m_auxStatementData.ptr)->m_statementAdjustmentRecords)
                       .ptr,index);
        StatementAdjustmentRecord::StatementAdjustmentRecord(&local_40,other);
        uVar6 = StatementAdjustmentRecord::GetByteCodeOffset(&local_40);
        if ((item.m_byteCodeOffset < uVar6) &&
           (uVar6 = StatementAdjustmentRecord::GetByteCodeOffset(&local_40),
           uVar6 < (uint)item._4_4_)) {
          record->m_adjustmentType = local_40.m_adjustmentType;
          record->m_byteCodeOffset = local_40.m_byteCodeOffset;
          return uVar8;
        }
        index = index + 1;
        uVar8 = (uint)(index < iVar1);
      } while (index != iVar1);
    }
  }
  return uVar8;
}

Assistant:

BOOL
    FunctionBody::GetBranchOffsetWithin(uint start, uint end, StatementAdjustmentRecord* record)
    {
        Assert(start < end);

        if (!this->GetStatementAdjustmentRecords())
        {
            // No Offset
            return FALSE;
        }

        int count = this->GetStatementAdjustmentRecords()->Count();
        for (int i = 0; i < count; i++)
        {
            StatementAdjustmentRecord item = this->GetStatementAdjustmentRecords()->Item(i);
            if (item.GetByteCodeOffset() > start && item.GetByteCodeOffset() < end)
            {
                *record = item;
                return TRUE;
            }
        }

        // No offset found in the range.
        return FALSE;
    }